

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O0

int mapFilterRareBiome(Layer *l,int *out,int x,int z,int w,int h)

{
  int iVar1;
  long *plVar2;
  byte bVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  long in_RSI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int id;
  int err;
  int i;
  uint64_t bm;
  uint64_t b;
  filter_data_t *f;
  int local_44;
  ulong local_40;
  ulong local_38;
  int local_4;
  
  plVar2 = *(long **)(in_RDI + 0x30);
  local_4 = (*(code *)plVar2[1])(in_RDI,in_RSI,in_EDX,in_ECX,in_R8D,in_R9D);
  if (local_4 == 0) {
    local_38 = 0;
    local_40 = 0;
    for (local_44 = 0; local_44 < in_R8D * in_R9D; local_44 = local_44 + 1) {
      iVar1 = *(int *)(in_RSI + (long)local_44 * 4);
      bVar3 = (byte)iVar1;
      if (iVar1 < 0x80) {
        local_38 = 1L << (bVar3 & 0x3f) | local_38;
      }
      else {
        local_40 = 1L << (bVar3 + 0x80 & 0x3f) | local_40;
      }
    }
    if ((local_38 & *(ulong *)(*plVar2 + 0x20)) == *(ulong *)(*plVar2 + 0x20)) {
      if ((local_40 & *(ulong *)(*plVar2 + 0x28)) == *(ulong *)(*plVar2 + 0x28)) {
        local_4 = 0;
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int mapFilterRareBiome(const Layer * l, int * out, int x, int z, int w, int h)
{
    const filter_data_t *f = (const filter_data_t*) l->data;
    uint64_t b, bm;
    int i;
    int err;

    err = f->map(l, out, x, z, w, h);
    if unlikely(err != 0)
        return err;

    b = 0; bm = 0;
    for (i = 0; i < w*h; i++)
    {
        int id = out[i];
        if (id < 128) b |= (1ULL << id);
        else bm |= (1ULL << (id-128));
    }
    if ((b & f->bf->raresToFind) ^ f->bf->raresToFind)
        return M_STOP;
    if ((bm & f->bf->raresToFindM) ^ f->bf->raresToFindM)
        return M_STOP;
    return 0;
}